

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Color ColorAlphaBlend(Color dst,Color src,Color tint)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint alpha;
  Color tint_local;
  Color src_local;
  Color dst_local;
  Color out;
  
  bVar1 = (byte)(((uint)src & 0xff) * ((uint)tint & 0xff) >> 8);
  bVar2 = (byte)(((uint)src >> 8 & 0xff) * ((uint)tint >> 8 & 0xff) >> 8);
  bVar3 = (byte)(((uint)src >> 0x10 & 0xff) * ((uint)tint >> 0x10 & 0xff) >> 8);
  bVar4 = (byte)(((uint)src >> 0x18) * ((uint)tint >> 0x18) >> 8);
  src_local = dst;
  if (bVar4 != 0) {
    if (bVar4 == 0xff) {
      src_local.r = bVar1;
      src_local.g = bVar2;
      src_local.b = bVar3;
      src_local.a = bVar4;
    }
    else {
      iVar5 = bVar4 + 1;
      tint_local.a = dst.a;
      src_local.a = (uchar)(iVar5 * 0x100 + (uint)tint_local.a * (0x100 - iVar5) >> 8);
      src_local.r = 0xff;
      src_local.g = 0xff;
      src_local.b = 0xff;
      if (src_local.a != 0) {
        src_local.g = (uchar)((ulong)((uint)bVar2 * iVar5 * 0x100 +
                                     ((uint)dst >> 8 & 0xff) * (uint)tint_local.a * (0x100 - iVar5))
                              / (ulong)src_local.a >> 8);
        src_local.r = (uchar)((ulong)((uint)bVar1 * iVar5 * 0x100 +
                                     ((uint)dst & 0xff) * (uint)tint_local.a * (0x100 - iVar5)) /
                              (ulong)src_local.a >> 8);
        src_local.b = (uchar)((ulong)((uint)bVar3 * iVar5 * 0x100 +
                                     ((uint)dst >> 0x10 & 0xff) * (uint)tint_local.a *
                                     (0x100 - iVar5)) / (ulong)src_local.a >> 8);
      }
    }
  }
  return src_local;
}

Assistant:

Color ColorAlphaBlend(Color dst, Color src, Color tint)
{
    Color out = WHITE;

    // Apply color tint to source color
    src.r = (unsigned char)(((unsigned int)src.r*(unsigned int)tint.r) >> 8);
    src.g = (unsigned char)(((unsigned int)src.g*(unsigned int)tint.g) >> 8);
    src.b = (unsigned char)(((unsigned int)src.b*(unsigned int)tint.b) >> 8);
    src.a = (unsigned char)(((unsigned int)src.a*(unsigned int)tint.a) >> 8);

//#define COLORALPHABLEND_FLOAT
#define COLORALPHABLEND_INTEGERS
#if defined(COLORALPHABLEND_INTEGERS)
    if (src.a == 0) out = dst;
    else if (src.a == 255) out = src;
    else
    {
        unsigned int alpha = (unsigned int)src.a + 1;     // We are shifting by 8 (dividing by 256), so we need to take that excess into account
        out.a = (unsigned char)(((unsigned int)alpha*256 + (unsigned int)dst.a*(256 - alpha)) >> 8);

        if (out.a > 0)
        {
            out.r = (unsigned char)((((unsigned int)src.r*alpha*256 + (unsigned int)dst.r*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
            out.g = (unsigned char)((((unsigned int)src.g*alpha*256 + (unsigned int)dst.g*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
            out.b = (unsigned char)((((unsigned int)src.b*alpha*256 + (unsigned int)dst.b*(unsigned int)dst.a*(256 - alpha))/out.a) >> 8);
        }
    }
#endif
#if defined(COLORALPHABLEND_FLOAT)
    if (src.a == 0) out = dst;
    else if (src.a == 255) out = src;
    else
    {
        Vector4 fdst = ColorNormalize(dst);
        Vector4 fsrc = ColorNormalize(src);
        Vector4 ftint = ColorNormalize(tint);
        Vector4 fout = { 0 };

        fout.w = fsrc.w + fdst.w*(1.0f - fsrc.w);

        if (fout.w > 0.0f)
        {
            fout.x = (fsrc.x*fsrc.w + fdst.x*fdst.w*(1 - fsrc.w))/fout.w;
            fout.y = (fsrc.y*fsrc.w + fdst.y*fdst.w*(1 - fsrc.w))/fout.w;
            fout.z = (fsrc.z*fsrc.w + fdst.z*fdst.w*(1 - fsrc.w))/fout.w;
        }

        out = (Color){ (unsigned char)(fout.x*255.0f), (unsigned char)(fout.y*255.0f), (unsigned char)(fout.z*255.0f), (unsigned char)(fout.w*255.0f) };
    }
#endif

    return out;
}